

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O2

int mbedtls_dhm_read_public(mbedtls_dhm_context *ctx,uchar *input,size_t ilen)

{
  int iVar1;
  int iVar2;
  
  iVar2 = -0x3080;
  if ((ilen != 0) && (ilen <= ctx->len)) {
    iVar1 = mbedtls_mpi_read_binary(&ctx->GY,input,ilen);
    iVar2 = iVar1 + -0x3200;
    if (iVar1 == 0) {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_dhm_read_public( mbedtls_dhm_context *ctx,
                     const unsigned char *input, size_t ilen )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    DHM_VALIDATE_RET( ctx != NULL );
    DHM_VALIDATE_RET( input != NULL );

    if( ilen < 1 || ilen > ctx->len )
        return( MBEDTLS_ERR_DHM_BAD_INPUT_DATA );

    if( ( ret = mbedtls_mpi_read_binary( &ctx->GY, input, ilen ) ) != 0 )
        return( MBEDTLS_ERR_DHM_READ_PUBLIC_FAILED + ret );

    return( 0 );
}